

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::InstallSegueBase(CWriter *this,Memory *memory,bool save_old_value)

{
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u;
  Newline *u_00;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  ExternalInstanceRef primary_memory;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2543:7)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2543:7)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  NonIndented(this,(function<void_()> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (save_old_value) {
    local_60._8_8_ = 0;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2545:17)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2545:17)>
               ::_M_manager;
    local_60._M_unused._M_object = this;
    NonIndented(this,(function<void_()> *)&local_60);
    u = extraout_RDX;
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
      u = extraout_RDX_00;
    }
    (anonymous_namespace)::CWriter::Write<char_const(&)[52],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [52])"void* segue_saved_base = wasm_rt_segue_read_base();",
               u);
    local_80._8_8_ = 0;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2547:17)>
               ::_M_invoke;
    local_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2547:17)>
               ::_M_manager;
    local_80._M_unused._M_object = this;
    NonIndented(this,(function<void_()> *)&local_80);
    if (local_70 != (code *)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
  }
  primary_memory.super_GlobalName.type = Memory;
  primary_memory.super_GlobalName.name = &memory->name;
  WriteData(this,"wasm_rt_segue_write_base(",0x19);
  Write(this,&primary_memory);
  (anonymous_namespace)::CWriter::Write<char_const(&)[8],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [8])".data);",u_00);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2552:15)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2552:15)>
             ::_M_manager;
  local_b0._M_unused._M_object = this;
  NonIndented(this,(function<void_()> *)&local_b0);
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
  }
  return;
}

Assistant:

void CWriter::InstallSegueBase(Memory* memory, bool save_old_value) {
  NonIndented(
      [&] { Write("#if WASM_RT_USE_SEGUE_FOR_THIS_MODULE", Newline()); });
  if (save_old_value) {
    NonIndented([&] { Write("#if !WASM_RT_SEGUE_FREE_SEGMENT", Newline()); });
    Write("void* segue_saved_base = wasm_rt_segue_read_base();", Newline());
    NonIndented([&] { Write("#endif", Newline()); });
  }
  auto primary_memory =
      ExternalInstanceRef(ModuleFieldType::Memory, memory->name);
  Write("wasm_rt_segue_write_base(", primary_memory, ".data);", Newline());
  NonIndented([&] { Write("#endif", Newline()); });
}